

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_fuzz.c
# Opt level: O3

int fuzzCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  ulong uVar1;
  SAMPLE *out;
  SAMPLE *in;
  float fVar2;
  
  if (inputBuffer == (void *)0x0) {
    if (framesPerBuffer != 0) {
      uVar1 = 0;
      do {
        *(undefined8 *)((long)outputBuffer + uVar1 * 8) = 0;
        uVar1 = uVar1 + 1;
      } while ((uVar1 & 0xffffffff) < framesPerBuffer);
    }
    gNumNoInputs = gNumNoInputs + 1;
  }
  else if (framesPerBuffer != 0) {
    uVar1 = 0;
    do {
      fVar2 = *(float *)((long)inputBuffer + uVar1 * 8);
      if (0.0 <= fVar2) {
        fVar2 = fVar2 + -1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + 1.0;
      }
      else {
        fVar2 = fVar2 + 1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + -1.0;
      }
      if (0.0 <= fVar2) {
        fVar2 = fVar2 + -1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + 1.0;
      }
      else {
        fVar2 = fVar2 + 1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + -1.0;
      }
      if (0.0 <= fVar2) {
        fVar2 = fVar2 + -1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + 1.0;
      }
      else {
        fVar2 = fVar2 + 1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + -1.0;
      }
      if (0.0 <= fVar2) {
        fVar2 = fVar2 + -1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + 1.0;
      }
      else {
        fVar2 = fVar2 + 1.0;
        fVar2 = fVar2 * fVar2 * fVar2 + -1.0;
      }
      *(float *)((long)outputBuffer + uVar1 * 8) = fVar2;
      *(undefined4 *)((long)outputBuffer + uVar1 * 8 + 4) =
           *(undefined4 *)((long)inputBuffer + uVar1 * 8 + 4);
      uVar1 = uVar1 + 1;
    } while ((uVar1 & 0xffffffff) < framesPerBuffer);
  }
  return 0;
}

Assistant:

static int fuzzCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    SAMPLE *out = (SAMPLE*)outputBuffer;
    const SAMPLE *in = (const SAMPLE*)inputBuffer;
    unsigned int i;
    (void) timeInfo; /* Prevent unused variable warnings. */
    (void) statusFlags;
    (void) userData;

    if( inputBuffer == NULL )
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = 0;  /* left - silent */
            *out++ = 0;  /* right - silent */
        }
        gNumNoInputs += 1;
    }
    else
    {
        for( i=0; i<framesPerBuffer; i++ )
        {
            *out++ = FUZZ(*in++);  /* left - distorted */
            *out++ = *in++;          /* right - clean */
        }
    }
    
    return paContinue;
}